

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O1

void modstl(double *x,int N,int f,int *s_window,double *lambda,double *seasonal,double *trend,
           double *remainder)

{
  double *y;
  double *x_00;
  ulong uVar1;
  size_t __size;
  int local_3c;
  int local_38;
  int s_window_;
  
  if (s_window == (int *)0x0) {
    local_3c = 0xd;
  }
  else {
    local_3c = *s_window;
  }
  __size = (long)N << 3;
  local_38 = f;
  y = (double *)malloc(__size);
  if (lambda == (double *)0x0) {
    memcpy(y,x,__size);
  }
  else {
    boxcox(x,N,lambda,y);
  }
  if (local_38 < 2) {
    x_00 = (double *)malloc(__size);
    if (0 < N) {
      uVar1 = 0;
      do {
        x_00[uVar1] = (double)(int)uVar1;
        uVar1 = uVar1 + 1;
      } while ((uint)N != uVar1);
    }
    s_window_ = N;
    supsmu(x_00,N,y,(double *)0x0,1,0.0,-1.0,trend);
    if (0 < s_window_) {
      uVar1 = 0;
      do {
        seasonal[uVar1] = 0.0;
        remainder[uVar1] = y[uVar1] - trend[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)N != uVar1);
    }
    free(x_00);
  }
  else {
    stl(y,N,local_38,"null",&local_3c,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
        (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,seasonal,trend,remainder);
  }
  free(y);
  return;
}

Assistant:

void modstl(double *x, int N, int f, int *s_window,double *lambda, double *seasonal, double *trend,double *remainder) {
    int i, s_window_;
    double *y,*t;


    s_window_ = (s_window == NULL) ? 13 : *s_window;

    y = (double*)malloc(sizeof(double)*N);

    if (lambda != NULL) {
        boxcox(x,N,lambda,y);
    } else {
        memcpy(y,x,sizeof(double)*N);
    }

    if (f > 1) {
        stl(y,N,f,"null",&s_window_,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seasonal,trend,remainder);
    } else {
        t = (double*) malloc(sizeof(double)*N);
        for(i = 0; i < N;++i) {
            t[i] = i;
        }
        supsmu(t,N,y,NULL,1,0,-1.0,trend);
        for(i = 0; i < N;++i) {
            seasonal[i] = 0.0;
            remainder[i] = y[i] - trend[i];
        }
        free(t);
    }

    free(y);
}